

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

void LZ4HC_setExternalDict(LZ4HC_CCtx_internal *ctxPtr,BYTE *newBlock)

{
  uint uVar1;
  U32 UVar2;
  uint uVar3;
  long in_RSI;
  long in_RDI;
  size_t delta;
  U32 h;
  U32 idx;
  U32 target;
  BYTE *base;
  U32 *hashTable;
  U16 *chainTable;
  undefined4 local_30;
  
  if (*(long *)(in_RDI + 0x40008) + (ulong)*(uint *)(in_RDI + 0x40018) + 4 <=
      *(ulong *)(in_RDI + 0x40000)) {
    uVar1 = ((int)*(undefined8 *)(in_RDI + 0x40000) + -3) - (int)*(undefined8 *)(in_RDI + 0x40008);
    for (local_30 = *(uint *)(in_RDI + 0x40020); local_30 < uVar1; local_30 = local_30 + 1) {
      UVar2 = LZ4HC_hashPtr((void *)0x2b6ea6);
      uVar3 = local_30 - *(int *)(in_RDI + (ulong)UVar2 * 4);
      if (0xffff < uVar3) {
        uVar3 = 0xffff;
      }
      *(short *)(in_RDI + 0x20000 + (ulong)(local_30 & 0xffff) * 2) = (short)uVar3;
      *(uint *)(in_RDI + (ulong)UVar2 * 4) = local_30;
    }
    *(uint *)(in_RDI + 0x40020) = uVar1;
  }
  *(undefined4 *)(in_RDI + 0x4001c) = *(undefined4 *)(in_RDI + 0x40018);
  *(int *)(in_RDI + 0x40018) =
       (int)*(undefined8 *)(in_RDI + 0x40000) - (int)*(undefined8 *)(in_RDI + 0x40008);
  *(undefined8 *)(in_RDI + 0x40010) = *(undefined8 *)(in_RDI + 0x40008);
  *(ulong *)(in_RDI + 0x40008) = in_RSI - (ulong)*(uint *)(in_RDI + 0x40018);
  *(long *)(in_RDI + 0x40000) = in_RSI;
  *(undefined4 *)(in_RDI + 0x40020) = *(undefined4 *)(in_RDI + 0x40018);
  *(undefined8 *)(in_RDI + 0x40028) = 0;
  return;
}

Assistant:

static void LZ4HC_setExternalDict(LZ4HC_CCtx_internal* ctxPtr, const BYTE* newBlock)
{
    DEBUGLOG(4, "LZ4HC_setExternalDict(%p, %p)", ctxPtr, newBlock);
    if (ctxPtr->end >= ctxPtr->base + ctxPtr->dictLimit + 4)
        LZ4HC_Insert (ctxPtr, ctxPtr->end-3);   /* Referencing remaining dictionary content */

    /* Only one memory segment for extDict, so any previous extDict is lost at this stage */
    ctxPtr->lowLimit  = ctxPtr->dictLimit;
    ctxPtr->dictLimit = (U32)(ctxPtr->end - ctxPtr->base);
    ctxPtr->dictBase  = ctxPtr->base;
    ctxPtr->base = newBlock - ctxPtr->dictLimit;
    ctxPtr->end  = newBlock;
    ctxPtr->nextToUpdate = ctxPtr->dictLimit;   /* match referencing will resume from there */

    /* cannot reference an extDict and a dictCtx at the same time */
    ctxPtr->dictCtx = NULL;
}